

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.h
# Opt level: O2

uint64_t __thiscall util::Hash128to64(util *this,uint128_t x)

{
  ulong uVar1;
  
  uVar1 = ((ulong)this ^ x.first) * -0x622015f714c7d297;
  uVar1 = (uVar1 >> 0x2f ^ x.first ^ uVar1) * -0x622015f714c7d297;
  return (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297;
}

Assistant:

inline uint64_t Hash128to64(uint128_t x) {
  // Murmur-inspired hashing.
  const uint64_t kMul = 0x9ddfea08eb382d69ULL;
  uint64_t a = (Uint128Low64(x) ^ Uint128High64(x)) * kMul;
  a ^= (a >> 47);
  uint64_t b = (Uint128High64(x) ^ a) * kMul;
  b ^= (b >> 47);
  b *= kMul;
  return b;
}